

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

RSA * PEM_read_bio_RSA_PUBKEY(BIO *bp,RSA **x,undefined1 *cb,void *u)

{
  RSA *pRVar1;
  void *u_local;
  pem_password_cb *cb_local;
  RSA **x_local;
  BIO *bp_local;
  
  pRVar1 = (RSA *)PEM_ASN1_read_bio(pem_read_bio_RSA_PUBKEY_d2i,"PUBLIC KEY",bp,x,cb,u);
  return pRVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}